

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O1

void CB_EXPLORE::predict_or_learn_greedy<false>(cb_explore *data,single_learner *base,example *ec)

{
  float fVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  action_scores probs;
  action_score local_50;
  v_array<ACTION_SCORE::action_score> local_48;
  
  local_48._begin = (ec->pred).a_s._begin;
  local_48._end = (action_score *)(ec->pred).scalars._end;
  local_48.end_array = (action_score *)(ec->pred).scalars.end_array;
  local_48.erase_count = (ec->pred).scalars.erase_count;
  v_array<ACTION_SCORE::action_score>::clear(&local_48);
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  v_array<ACTION_SCORE::action_score>::resize(&local_48,(ulong)(data->cbcs).num_actions);
  if ((data->cbcs).num_actions != 0) {
    uVar8 = 0;
    do {
      local_50.score = 0.0;
      local_50.action = uVar8;
      v_array<ACTION_SCORE::action_score>::push_back(&local_48,&local_50);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (data->cbcs).num_actions);
  }
  auVar5 = _DAT_00285f50;
  auVar4 = _DAT_00283fa0;
  auVar3 = _DAT_0027ebf0;
  lVar6 = (long)local_48._end - (long)local_48._begin;
  if (local_48._begin <= local_48._end && lVar6 != 0) {
    fVar1 = data->epsilon;
    uVar9 = lVar6 >> 3;
    uVar8 = (ec->pred).multiclass - 1;
    fVar11 = fVar1 / (float)uVar9;
    uVar7 = lVar6 - 8;
    auVar15._8_4_ = (int)uVar7;
    auVar15._0_8_ = uVar7;
    auVar15._12_4_ = (int)(uVar7 >> 0x20);
    auVar12._0_8_ = uVar7 >> 3;
    auVar12._8_8_ = auVar15._8_8_ >> 3;
    uVar10 = 0;
    auVar12 = auVar12 ^ _DAT_0027ebf0;
    do {
      auVar14._8_4_ = (int)uVar10;
      auVar14._0_8_ = uVar10;
      auVar14._12_4_ = (int)(uVar10 >> 0x20);
      auVar15 = (auVar14 | auVar4) ^ auVar3;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        local_48._begin[uVar10].score = fVar11;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        local_48._begin[uVar10 + 1].score = fVar11;
      }
      auVar15 = (auVar14 | auVar5) ^ auVar3;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar15._0_4_ <= auVar12._0_4_)) {
        local_48._begin[uVar10 + 2].score = fVar11;
        local_48._begin[uVar10 + 3].score = fVar11;
      }
      uVar10 = uVar10 + 4;
    } while (((uVar7 >> 3) + 4 & 0xfffffffffffffffc) != uVar10);
    uVar2 = (int)uVar9 - 1;
    if (uVar8 < uVar9) {
      uVar2 = uVar8;
    }
    local_48._begin[uVar2].score = (1.0 - fVar1) + local_48._begin[uVar2].score;
  }
  (ec->pred).scalars.end_array = (float *)local_48.end_array;
  (ec->pred).scalars.erase_count = local_48.erase_count;
  (ec->pred).a_s._begin = local_48._begin;
  (ec->pred).scalars._end = (float *)local_48._end;
  return;
}

Assistant:

void predict_or_learn_greedy(cb_explore& data, single_learner& base, example& ec)
{
  // Explore uniform random an epsilon fraction of the time.
  // TODO: pointers are copied here. What happens if base.learn/base.predict re-allocs?
  // ec.pred.a_s = probs; will restore the than free'd memory
  action_scores probs = ec.pred.a_s;
  probs.clear();

  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  // pre-allocate pdf
  probs.resize(data.cbcs.num_actions);
  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0});
  generate_epsilon_greedy(data.epsilon, ec.pred.multiclass - 1, begin_scores(probs), end_scores(probs));

  ec.pred.a_s = probs;
}